

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_card.cc
# Opt level: O1

string * __thiscall
hanabi_learning_env::HanabiCard::ToString_abi_cxx11_
          (string *__return_storage_ptr__,HanabiCard *this)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_60;
  ulong local_58;
  long local_50;
  long lStack_48;
  undefined1 *local_40;
  ulong local_38;
  undefined1 local_30 [16];
  
  if ((this->color_ < 0) || (this->rank_ < 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"XX","");
  }
  else {
    local_38 = 0;
    local_30[0] = 0;
    local_40 = local_30;
    ColorIndexToChar(this->color_);
    plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_40,local_38,0,'\x01');
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_50 = *plVar3;
      lStack_48 = plVar2[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar3;
      local_60 = (long *)*plVar2;
    }
    local_58 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    RankIndexToChar(this->rank_);
    plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_60,local_58,0,'\x01');
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar4) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_60 != &local_50) {
      operator_delete(local_60);
    }
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HanabiCard::ToString() const {
  if (!IsValid()) {
    return std::string("XX");
  }
  return std::string() + ColorIndexToChar(Color()) + RankIndexToChar(Rank());
}